

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O0

void mainchan_open_confirmation(Channel *chan)

{
  LogContext *pLVar1;
  PktOutQueue *cl;
  _Bool _Var2;
  int authtype;
  char *pcVar3;
  char *local_58;
  char *x11_setup_err;
  X11FakeAuth *pXStack_48;
  _Bool retry_cmd_now;
  X11FakeAuth *x11auth;
  X11Display *x11disp;
  char *cmd;
  char *val;
  char *key;
  PacketProtocolLayer *ppl;
  mainchan *mc;
  Channel *chan_local;
  
  ppl = (PacketProtocolLayer *)&chan[-5].initial_fixed_window_size;
  key = *(char **)&chan[-4].initial_fixed_window_size;
  mc = (mainchan *)chan;
  seat_update_specials_menu(*(Seat **)(*(long *)&chan[-4].initial_fixed_window_size + 0x48));
  pLVar1 = *(LogContext **)(key + 0x40);
  pcVar3 = dupprintf("Opened main channel");
  logevent_and_free(pLVar1,pcVar3);
  seat_notify_session_started((Seat *)ppl->in_pq[1].pqb.end.formal_size);
  if (((ulong)(ppl->ic_process_queue).fn & 0x100000000) != 0) {
    sshfwd_hint_channel_is_simple((SshChannel *)ppl->vt);
  }
  if (*(int *)&(ppl->ic_process_queue).fn == 0) {
    x11_setup_err._7_1_ = 0;
    _Var2 = conf_get_bool((Conf *)ppl->bpp,0xaa);
    if (_Var2) {
      pcVar3 = conf_get_str((Conf *)ppl->bpp,0xab);
      x11auth = (X11FakeAuth *)x11_setup_display(pcVar3,(Conf *)ppl->bpp,&local_58);
      if ((X11Display *)x11auth == (X11Display *)0x0) {
        pLVar1 = *(LogContext **)(key + 0x40);
        pcVar3 = dupprintf("X11 forwarding not enabled: unable to initialise X display: %s",local_58
                          );
        logevent_and_free(pLVar1,pcVar3);
        safefree(local_58);
      }
      else {
        cl = ppl->out_pq;
        authtype = conf_get_int((Conf *)ppl->bpp,0xac);
        pXStack_48 = ssh_add_x11_display((ConnectionLayer *)cl,authtype,(X11Display *)x11auth);
        sshfwd_request_x11_forwarding
                  ((SshChannel *)ppl->vt,true,pXStack_48->protoname,pXStack_48->datastring,
                   *(int *)&x11auth->field_0x14,false);
        *(undefined1 *)((long)&(ppl->ic_process_queue).fn + 5) = 1;
      }
    }
    _Var2 = ssh_agent_forwarding_permitted((ConnectionLayer *)ppl->out_pq);
    if (_Var2) {
      sshfwd_request_agent_forwarding((SshChannel *)ppl->vt,true);
      *(undefined1 *)((long)&(ppl->ic_process_queue).fn + 6) = 1;
    }
    _Var2 = conf_get_bool((Conf *)ppl->bpp,0x16);
    if (!_Var2) {
      sshfwd_request_pty((SshChannel *)ppl->vt,true,(Conf *)ppl->bpp,
                         *(int *)((long)&ppl->selfptr + 4),*(int *)&ppl->logctx);
      *(undefined1 *)((long)&(ppl->ic_process_queue).fn + 7) = 1;
    }
    cmd = conf_get_str_strs((Conf *)ppl->bpp,0x38,(char *)0x0,&val);
    while (cmd != (char *)0x0) {
      sshfwd_send_env_var((SshChannel *)ppl->vt,true,val,cmd);
      *(int *)((long)&(ppl->ic_process_queue).ctx + 4) =
           *(int *)((long)&(ppl->ic_process_queue).ctx + 4) + 1;
      cmd = conf_get_str_strs((Conf *)ppl->bpp,0x38,val,&val);
    }
    if (*(int *)((long)&(ppl->ic_process_queue).ctx + 4) != 0) {
      pLVar1 = *(LogContext **)(key + 0x40);
      pcVar3 = dupprintf("Sent %d environment variables",
                         (ulong)*(uint *)((long)&(ppl->ic_process_queue).ctx + 4));
      logevent_and_free(pLVar1,pcVar3);
    }
    x11disp = (X11Display *)conf_get_str((Conf *)ppl->bpp,0x14);
    _Var2 = conf_get_bool((Conf *)ppl->bpp,0x30);
    if (_Var2) {
      _Var2 = sshfwd_start_subsystem((SshChannel *)ppl->vt,true,&x11disp->unixdomain);
      x11_setup_err._7_1_ = (_Var2 ^ 0xffU) & 1;
    }
    else if (x11disp->unixdomain == false) {
      sshfwd_start_shell((SshChannel *)ppl->vt,true);
    }
    else {
      sshfwd_start_command((SshChannel *)ppl->vt,true,&x11disp->unixdomain);
    }
    if ((x11_setup_err._7_1_ & 1) == 0) {
      *(undefined1 *)&(ppl->ic_process_queue).ctx = 1;
    }
    else {
      mainchan_try_fallback_command((mainchan *)ppl);
    }
  }
  else {
    ssh_set_ldisc_option((ConnectionLayer *)ppl->out_pq,1,true);
    ssh_set_ldisc_option((ConnectionLayer *)ppl->out_pq,0,true);
    mainchan_ready((mainchan *)ppl);
  }
  return;
}

Assistant:

static void mainchan_open_confirmation(Channel *chan)
{
    mainchan *mc = container_of(chan, mainchan, chan);
    PacketProtocolLayer *ppl = mc->ppl; /* for ppl_logevent */

    seat_update_specials_menu(mc->ppl->seat);
    ppl_logevent("Opened main channel");
    seat_notify_session_started(mc->ppl->seat);

    if (mc->is_simple)
        sshfwd_hint_channel_is_simple(mc->sc);

    if (mc->type == MAINCHAN_SESSION) {
        /*
         * Send the CHANNEL_REQUESTS for the main session channel.
         */
        char *key, *val, *cmd;
        struct X11Display *x11disp;
        struct X11FakeAuth *x11auth;
        bool retry_cmd_now = false;

        if (conf_get_bool(mc->conf, CONF_x11_forward)) {
            char *x11_setup_err;
            if ((x11disp = x11_setup_display(
                     conf_get_str(mc->conf, CONF_x11_display),
                     mc->conf, &x11_setup_err)) == NULL) {
                ppl_logevent("X11 forwarding not enabled: unable to"
                             " initialise X display: %s", x11_setup_err);
                sfree(x11_setup_err);
            } else {
                x11auth = ssh_add_x11_display(
                    mc->cl, conf_get_int(mc->conf, CONF_x11_auth), x11disp);

                sshfwd_request_x11_forwarding(
                    mc->sc, true, x11auth->protoname, x11auth->datastring,
                    x11disp->screennum, false);
                mc->req_x11 = true;
            }
        }

        if (ssh_agent_forwarding_permitted(mc->cl)) {
            sshfwd_request_agent_forwarding(mc->sc, true);
            mc->req_agent = true;
        }

        if (!conf_get_bool(mc->conf, CONF_nopty)) {
            sshfwd_request_pty(
                mc->sc, true, mc->conf, mc->term_width, mc->term_height);
            mc->req_pty = true;
        }

        for (val = conf_get_str_strs(mc->conf, CONF_environmt, NULL, &key);
             val != NULL;
             val = conf_get_str_strs(mc->conf, CONF_environmt, key, &key)) {
            sshfwd_send_env_var(mc->sc, true, key, val);
            mc->n_req_env++;
        }
        if (mc->n_req_env)
            ppl_logevent("Sent %d environment variables", mc->n_req_env);

        cmd = conf_get_str(mc->conf, CONF_remote_cmd);
        if (conf_get_bool(mc->conf, CONF_ssh_subsys)) {
            retry_cmd_now = !sshfwd_start_subsystem(mc->sc, true, cmd);
        } else if (*cmd) {
            sshfwd_start_command(mc->sc, true, cmd);
        } else {
            sshfwd_start_shell(mc->sc, true);
        }

        if (retry_cmd_now)
            mainchan_try_fallback_command(mc);
        else
            mc->req_cmd_primary = true;

    } else {
        ssh_set_ldisc_option(mc->cl, LD_ECHO, true);
        ssh_set_ldisc_option(mc->cl, LD_EDIT, true);
        mainchan_ready(mc);
    }
}